

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::remap_pls_variables(CompilerGLSL *this)

{
  StorageClass SVar1;
  pointer pPVar2;
  SPIRVariable *pSVar3;
  SPIRType *pSVar4;
  runtime_error *prVar5;
  pointer pPVar6;
  bool bVar7;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pPVar6 = (this->pls_inputs).
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_start;
  pPVar2 = (this->pls_inputs).
           super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl
           .super__Vector_impl_data._M_finish;
  while( true ) {
    if (pPVar6 == pPVar2) {
      pPVar6 = (this->pls_outputs).
               super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pPVar2 = (this->pls_outputs).
               super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (pPVar6 == pPVar2) {
          return;
        }
        pSVar3 = Variant::get<spirv_cross::SPIRVariable>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + pPVar6->id);
        if (pSVar3->storage != StorageClassOutput) break;
        pSVar3->remapped_variable = true;
        pPVar6 = pPVar6 + 1;
      }
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48[0] = local_38;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"Can only use out variables for PLS outputs.","");
      ::std::runtime_error::runtime_error(prVar5,(string *)local_48);
      *(undefined ***)prVar5 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar3 = Variant::get<spirv_cross::SPIRVariable>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        pPVar6->id);
    SVar1 = pSVar3->storage;
    if (SVar1 == StorageClassUniformConstant) {
      pSVar4 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(pSVar3->super_IVariant).field_0xc);
      bVar7 = (pSVar4->image).dim == DimSubpassData;
      SVar1 = pSVar3->storage;
    }
    else {
      bVar7 = false;
    }
    if ((SVar1 != StorageClassInput) && (!bVar7)) break;
    pSVar3->remapped_variable = true;
    pPVar6 = pPVar6 + 1;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"Can only use in and target variables for PLS inputs.","");
  ::std::runtime_error::runtime_error(prVar5,(string *)local_48);
  *(undefined ***)prVar5 = &PTR__runtime_error_003f8e68;
  __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerGLSL::remap_pls_variables()
{
	for (auto &input : pls_inputs)
	{
		auto &var = get<SPIRVariable>(input.id);

		bool input_is_target = false;
		if (var.storage == StorageClassUniformConstant)
		{
			auto &type = get<SPIRType>(var.basetype);
			input_is_target = type.image.dim == DimSubpassData;
		}

		if (var.storage != StorageClassInput && !input_is_target)
			SPIRV_CROSS_THROW("Can only use in and target variables for PLS inputs.");
		var.remapped_variable = true;
	}

	for (auto &output : pls_outputs)
	{
		auto &var = get<SPIRVariable>(output.id);
		if (var.storage != StorageClassOutput)
			SPIRV_CROSS_THROW("Can only use out variables for PLS outputs.");
		var.remapped_variable = true;
	}
}